

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O2

int Gia_ManBuiltInSimCheckEqual(Gia_Man_t *p,int iLit0,int iLit1)

{
  word *pwVar1;
  word *pwVar2;
  ulong *puVar3;
  ulong *puVar4;
  int iVar5;
  int iVar6;
  word *pwVar7;
  word *pwVar8;
  ulong uVar9;
  ulong uVar10;
  
  iVar5 = Abc_Lit2Var(iLit0);
  pwVar7 = Gia_ManBuiltInData(p,iVar5);
  iVar5 = Abc_Lit2Var(iLit1);
  pwVar8 = Gia_ManBuiltInData(p,iVar5);
  if ((p->fBuiltInSim == 0) && (p->fIncrSim == 0)) {
    __assert_fail("p->fBuiltInSim || p->fIncrSim",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim.c"
                  ,0x38a,"int Gia_ManBuiltInSimCheckEqual(Gia_Man_t *, int, int)");
  }
  iVar5 = Abc_LitIsCompl(iLit0);
  iVar6 = Abc_LitIsCompl(iLit1);
  uVar9 = 0;
  if (0 < p->nSimWords) {
    uVar9 = (ulong)(uint)p->nSimWords;
  }
  uVar10 = 0;
  if (iVar5 == 0) {
    if (iVar6 == 0) {
      do {
        if (uVar9 == uVar10) {
          return 1;
        }
        pwVar1 = pwVar7 + uVar10;
        pwVar2 = pwVar8 + uVar10;
        uVar10 = uVar10 + 1;
      } while (*pwVar1 == *pwVar2);
    }
    else {
      do {
        if (uVar9 == uVar10) {
          return 1;
        }
        puVar3 = pwVar8 + uVar10;
        puVar4 = pwVar7 + uVar10;
        uVar10 = uVar10 + 1;
      } while ((*puVar3 ^ *puVar4) == 0xffffffffffffffff);
    }
  }
  else if (iVar6 == 0) {
    do {
      if (uVar9 == uVar10) {
        return 1;
      }
      puVar3 = pwVar8 + uVar10;
      puVar4 = pwVar7 + uVar10;
      uVar10 = uVar10 + 1;
    } while ((*puVar3 ^ *puVar4) == 0xffffffffffffffff);
  }
  else {
    do {
      if (uVar9 == uVar10) {
        return 1;
      }
      pwVar1 = pwVar7 + uVar10;
      pwVar2 = pwVar8 + uVar10;
      uVar10 = uVar10 + 1;
    } while (*pwVar1 == *pwVar2);
  }
  return 0;
}

Assistant:

int Gia_ManBuiltInSimCheckEqual( Gia_Man_t * p, int iLit0, int iLit1 )
{
    word * pInfo0 = Gia_ManBuiltInData( p, Abc_Lit2Var(iLit0) );
    word * pInfo1 = Gia_ManBuiltInData( p, Abc_Lit2Var(iLit1) ); int w;
    assert( p->fBuiltInSim || p->fIncrSim );

//    printf( "%d %d\n", Abc_LitIsCompl(iLit0), Abc_LitIsCompl(iLit1) );
//    Extra_PrintBinary( stdout, pInfo0, 64*p->nSimWords ); printf( "\n" );
//    Extra_PrintBinary( stdout, pInfo1, 64*p->nSimWords ); printf( "\n" );
//    printf( "\n" );

    if ( Abc_LitIsCompl(iLit0) )
    {
        if (  Abc_LitIsCompl(iLit1) )
        {
            for ( w = 0; w < p->nSimWords; w++ )
                if ( ~pInfo0[w] != ~pInfo1[w] )
                    return 0;
        }
        else 
        {
            for ( w = 0; w < p->nSimWords; w++ )
                if ( ~pInfo0[w] != pInfo1[w] )
                    return 0;
        }
    }
    else 
    {
        if (  Abc_LitIsCompl(iLit1) )
        {
            for ( w = 0; w < p->nSimWords; w++ )
                if ( pInfo0[w] != ~pInfo1[w] )
                    return 0;
        }
        else 
        {
            for ( w = 0; w < p->nSimWords; w++ )
                if ( pInfo0[w] != pInfo1[w] )
                    return 0;
        }
    }
    return 1;
}